

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

void STAT_StartNewGame(char *mapname)

{
  int iVar1;
  uint uVar2;
  FEpisode *pFVar3;
  uint local_14;
  uint j;
  char *mapname_local;
  
  TArray<OneLevel,_OneLevel>::Clear(&LevelData);
  iVar1 = FIntCVar::operator_cast_to_int(&deathmatch);
  if ((iVar1 == 0) && ((multiplayer & 1U) == 0)) {
    for (local_14 = 0; uVar2 = TArray<FEpisode,_FEpisode>::Size(&AllEpisodes), local_14 < uVar2;
        local_14 = local_14 + 1) {
      pFVar3 = TArray<FEpisode,_FEpisode>::operator[](&AllEpisodes,(ulong)local_14);
      iVar1 = FString::CompareNoCase(&pFVar3->mEpisodeMap,mapname);
      if (iVar1 == 0) {
        StartEpisode = TArray<FEpisode,_FEpisode>::operator[](&AllEpisodes,(ulong)local_14);
        return;
      }
    }
  }
  StartEpisode = (FEpisode *)0x0;
  return;
}

Assistant:

void STAT_StartNewGame(const char *mapname)
{
	LevelData.Clear();
	if (!deathmatch && !multiplayer)
	{
		for(unsigned int j=0;j<AllEpisodes.Size();j++)
		{
			if (!AllEpisodes[j].mEpisodeMap.CompareNoCase(mapname))
			{
				StartEpisode = &AllEpisodes[j];
				return;
			}
		}
	}
	StartEpisode = NULL;
}